

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

bool __thiscall ON_Matrix::IsRowOrthoNormal(ON_Matrix *this)

{
  double **ppdVar1;
  double **this_m;
  int local_20;
  int iStack_1c;
  bool rc;
  int j;
  int i;
  double d;
  ON_Matrix *this_local;
  
  this_m._7_1_ = IsRowOrthoganal(this);
  if (this_m._7_1_) {
    ppdVar1 = ThisM(this);
    for (iStack_1c = 0; iStack_1c < this->m_row_count; iStack_1c = iStack_1c + 1) {
      _j = 0.0;
      for (local_20 = 0; local_20 < this->m_col_count; local_20 = local_20 + 1) {
        _j = ppdVar1[iStack_1c][local_20] * ppdVar1[iStack_1c][local_20] + _j;
      }
      if (1.490116119385e-08 <= ABS(1.0 - _j)) {
        this_m._7_1_ = false;
      }
    }
  }
  return this_m._7_1_;
}

Assistant:

bool ON_Matrix::IsRowOrthoNormal() const
{
  double d;
  int i, j;
  bool rc = IsRowOrthoganal();
  if ( rc ) {
    double const*const* this_m = ThisM();
    for ( i = 0; i < m_row_count; i++ ) {
      d = 0.0;
      for ( j = 0; j < m_col_count; j++ ) {
        d += this_m[i][j]*this_m[i][j];
      }
      if ( fabs(1.0-d) >=  ON_SQRT_EPSILON )
        rc = false;
    }
  }
  return rc;
}